

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O0

bool am_active_if_change_width_and_not_user_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  bool local_5a;
  Am_Object local_38 [3];
  Am_Object local_20;
  Am_Object *local_18;
  Am_Object *self_local;
  
  local_18 = self;
  Am_Object::Get_Sibling(&local_20,(Am_Slot_Key)self,(ulong)Am_CHANGE_WIDTH);
  pAVar3 = Am_Object::Get(&local_20,0x169,0);
  bVar1 = Am_Value::Valid(pAVar3);
  local_5a = false;
  if (bVar1) {
    Am_Object::Get_Sibling(local_38,(Am_Slot_Key)local_18,(ulong)Am_WIDTH_HOW);
    pAVar3 = Am_Object::Get(local_38,0x169,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    local_5a = iVar2 < 100;
  }
  self_local._7_1_ = local_5a;
  if (bVar1) {
    Am_Object::~Am_Object(local_38);
  }
  Am_Object::~Am_Object(&local_20);
  return (bool)(self_local._7_1_ & 1);
}

Assistant:

Am_Define_Formula(bool, am_active_if_change_width_and_not_user)
{
  return self.Get_Sibling(Am_CHANGE_WIDTH).Get(Am_VALUE).Valid() &&
         (int)self.Get_Sibling(Am_WIDTH_HOW).Get(Am_VALUE) < am_ask_user_base;
}